

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex.cpp
# Opt level: O3

void __thiscall ftxui::anon_unknown_2::Flex::ComputeRequirement(Flex *this)

{
  Requirement *pRVar1;
  pointer psVar2;
  element_type *peVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Selection SVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  pRVar1 = &(this->super_Node).requirement_;
  (this->super_Node).requirement_.min_x = 0;
  (this->super_Node).requirement_.min_y = 0;
  psVar2 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar2 != (this->super_Node).children_.
                super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (*((psVar2->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Node[2])
              ();
    peVar3 = (((this->super_Node).children_.
               super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar10 = (peVar3->requirement_).min_x;
    iVar11 = (peVar3->requirement_).min_y;
    iVar12 = (peVar3->requirement_).flex_grow_x;
    iVar13 = (peVar3->requirement_).flex_grow_y;
    iVar6 = (peVar3->requirement_).flex_shrink_x;
    iVar7 = (peVar3->requirement_).flex_shrink_y;
    SVar8 = (peVar3->requirement_).selection;
    iVar9 = (peVar3->requirement_).selected_box.x_min;
    iVar4 = (peVar3->requirement_).selected_box.x_max;
    iVar5 = (peVar3->requirement_).selected_box.y_min;
    (this->super_Node).requirement_.selected_box.y_max = (peVar3->requirement_).selected_box.y_max;
    (this->super_Node).requirement_.selected_box.x_max = iVar4;
    (this->super_Node).requirement_.selected_box.y_min = iVar5;
    (this->super_Node).requirement_.flex_shrink_x = iVar6;
    (this->super_Node).requirement_.flex_shrink_y = iVar7;
    (this->super_Node).requirement_.selection = SVar8;
    (this->super_Node).requirement_.selected_box.x_min = iVar9;
    pRVar1->min_x = iVar10;
    pRVar1->min_y = iVar11;
    (this->super_Node).requirement_.flex_grow_x = iVar12;
    (this->super_Node).requirement_.flex_grow_y = iVar13;
  }
  (*this->f_)(pRVar1);
  return;
}

Assistant:

void ComputeRequirement() override {
    requirement_.min_x = 0;
    requirement_.min_y = 0;
    if (!children_.empty()) {
      children_[0]->ComputeRequirement();
      requirement_ = children_[0]->requirement();
    }
    f_(requirement_);
  }